

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vreg_assignment.cpp
# Opt level: O2

int __thiscall mocker::VRegAssignment::init(VRegAssignment *this,EVP_PKEY_CTX *ctx)

{
  pointer ppVar1;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  EVP_PKEY_CTX *pEVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *this_00;
  EVP_PKEY_CTX *pEVar6;
  pointer ppVar7;
  EVP_PKEY_CTX *pEVar8;
  shared_ptr<mocker::ir::Phi> phi;
  undefined1 local_70 [16];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> reg;
  
  pEVar8 = ctx + 0x38;
  pEVar3 = pEVar8;
  while (pEVar3 = *(EVP_PKEY_CTX **)pEVar3, pEVar3 != pEVar8) {
    pEVar6 = pEVar3 + 0x18;
    while (pEVar6 = *(EVP_PKEY_CTX **)pEVar6, pEVar6 != pEVar3 + 0x18) {
      ir::getDest((shared_ptr<mocker::ir::IRInst> *)&dest);
      if (dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reg,
                       "vir_",&(dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->identifier);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&phi,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reg,"_"
                      );
        std::make_shared<mocker::nasm::Register,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        p_Var2 = &std::__detail::
                  _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,(key_type *)&dest)->
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var2,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                          local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
        std::__cxx11::string::~string((string *)&phi);
        std::__cxx11::string::~string((string *)&reg);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  pEVar3 = pEVar8;
  do {
    pEVar3 = *(EVP_PKEY_CTX **)pEVar3;
    if (pEVar3 == pEVar8) {
      return (int)pEVar3;
    }
    pEVar6 = pEVar3 + 0x18;
    while (pEVar6 = *(EVP_PKEY_CTX **)pEVar6, pEVar6 != pEVar3 + 0x18) {
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&phi,(shared_ptr<mocker::ir::IRInst> *)(pEVar6 + 0x10));
      if (phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ppVar1 = ((phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 options).
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar7 = ((phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->options).
                      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1;
            ppVar7 = ppVar7 + 1) {
          ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&reg);
          if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            __assert_fail("reg",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/vreg_assignment.cpp"
                          ,0x1c,"void mocker::VRegAssignment::init(const ir::FunctionModule &)");
          }
          pmVar4 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,(key_type *)&reg);
          pmVar5 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,&((phi.
                                           super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_Definition).dest);
          if ((pmVar4->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr != (pmVar5->
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr) {
            p_Var2 = &std::__detail::
                      _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&((phi.
                                              super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_Definition).dest)->
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
            this_00 = &std::__detail::
                       _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)this,(key_type *)&reg)->
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (this_00,p_Var2);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  } while( true );
}

Assistant:

void VRegAssignment::init(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      mp[dest] = std::make_shared<nasm::Register>("vir_" +
          dest->getIdentifier() + "_");
    }
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        continue;

      for (auto &option : phi->getOptions()) {
        auto reg = ir::dycLocalReg(option.first);
        assert(reg);
        if (mp[reg] != mp[phi->getDest()]) {
          mp[reg] = mp[phi->getDest()];
        }
      }
    }
  }
}